

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O3

void __thiscall
booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr
          (intrusive_ptr<booster::refcounted> *this)

{
  refcounted *prVar1;
  long lVar2;
  
  prVar1 = this->p_;
  if (prVar1 != (refcounted *)0x0) {
    lVar2 = atomic_counter::dec(&prVar1->refs_);
    if (lVar2 == 0) {
      (*prVar1->_vptr_refcounted[1])(prVar1);
      return;
    }
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }